

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void aom_highbd_comp_mask_pred_avx2
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined1 auVar1 [32];
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i s1_00;
  __m256i s1_01;
  __m256i s1_02;
  __m256i s1_03;
  __m256i s0_00;
  __m256i s0_01;
  __m256i s0_02;
  __m256i s0_03;
  undefined1 auVar2 [16];
  uint16_t *puVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  longlong lVar4;
  longlong lVar5;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  undefined1 auVar6 [32];
  longlong lVar11;
  longlong lVar12;
  longlong in_XMM1_Qa;
  longlong in_XMM1_Qb;
  undefined1 (*in_stack_00000008) [16];
  __m256i comp_2;
  __m256i m23_16;
  __m256i m01_16;
  __m256i s3;
  __m256i s1_2;
  __m256i s2;
  __m256i s0_2;
  int x;
  __m256i comp_1;
  __m256i m_16_1;
  __m256i s1_1;
  __m256i s0_1;
  __m256i comp;
  __m256i m_16;
  __m256i m;
  __m128i m_h;
  __m128i m_l;
  __m256i s1;
  __m256i s0;
  __m256i zero;
  int stride1;
  int stride0;
  uint16_t *src1;
  uint16_t *src0;
  uint16_t *comp_pred;
  uint16_t *ref;
  uint16_t *pred;
  int i;
  int local_558;
  uint16_t *local_550;
  uint16_t *in_stack_fffffffffffffac0;
  int local_424;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  longlong in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  longlong in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  longlong in_stack_fffffffffffffc60;
  longlong in_stack_fffffffffffffc68;
  longlong in_stack_fffffffffffffc70;
  undefined1 local_360 [24];
  longlong lStack_348;
  uint16_t *local_2b0;
  uint16_t *local_2a8;
  longlong *local_2a0;
  int local_288;
  
  local_288 = 0;
  local_2a8 = (uint16_t *)(in_R8 << 1);
  local_2a0 = (longlong *)(in_RDI << 1);
  local_550 = (uint16_t *)(in_RSI << 1);
  if (mask_stride != 0) {
    local_550 = local_2a8;
    local_2a8 = (uint16_t *)(in_RSI << 1);
  }
  local_2b0 = local_550;
  local_558 = in_EDX;
  if (mask_stride != 0) {
    local_558 = in_R9D;
    in_R9D = in_EDX;
  }
  lVar9 = 0;
  lVar11 = 0;
  if (in_EDX == 8) {
    do {
      lVar4 = lVar9;
      lVar7 = lVar11;
      lVar9 = 0;
      lVar11 = 0;
      mm256_loadu2_16(in_stack_fffffffffffffac0,local_2a8);
      lVar5 = lVar4;
      lVar8 = lVar7;
      mm256_loadu2_16(in_stack_fffffffffffffac0,local_2a8);
      local_360._16_8_ = in_XMM1_Qa;
      lStack_348 = in_XMM1_Qb;
      local_360._8_8_ = 0;
      local_360._0_8_ = *(ulong *)*in_stack_00000008;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(*in_stack_00000008 + 8);
      auVar6._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * local_360._0_16_;
      auVar6._16_16_ = ZEXT116(0) * stack0xfffffffffffffcb0 + ZEXT116(1) * auVar2;
      local_360._16_8_ = auVar6._16_8_;
      lStack_348 = auVar6._24_8_;
      auVar1._16_8_ = local_360._16_8_;
      auVar1._0_16_ = auVar6._0_16_;
      auVar1._24_8_ = lStack_348;
      vpunpcklbw_avx2(auVar1,ZEXT1632(ZEXT816(0)));
      s0_00[1] = in_stack_fffffffffffffc60;
      s0_00[0] = in_stack_fffffffffffffc58;
      s0_00[2] = in_stack_fffffffffffffc68;
      s0_00[3] = in_stack_fffffffffffffc70;
      s1_00[1] = in_stack_fffffffffffffc40;
      s1_00[0] = in_stack_fffffffffffffc38;
      s1_00[2] = in_stack_fffffffffffffc48;
      s1_00[3] = in_stack_fffffffffffffc50;
      a[1] = in_stack_fffffffffffffc20;
      a[0] = in_stack_fffffffffffffc18;
      a[2] = in_stack_fffffffffffffc28;
      a[3] = in_stack_fffffffffffffc30;
      in_XMM1_Qa = lVar5;
      in_XMM1_Qb = lVar8;
      highbd_comp_mask_pred_line_avx2(s0_00,s1_00,a);
      *local_2a0 = lVar4;
      local_2a0[1] = lVar7;
      local_2a0[2] = lVar9;
      local_2a0[3] = lVar11;
      in_stack_00000008 = (undefined1 (*) [16])(*in_stack_00000008 + ((int)mask << 1));
      local_2a0 = local_2a0 + 4;
      local_288 = local_288 + 2;
      in_stack_fffffffffffffc60 = lVar4;
      in_stack_fffffffffffffc68 = lVar7;
      in_stack_fffffffffffffc70 = lVar9;
      _local_360 = auVar6;
    } while (local_288 < in_ECX);
  }
  else if (in_EDX == 0x10) {
    do {
      lVar9 = *(longlong *)local_2a8;
      lVar11 = *(longlong *)(local_2a8 + 4);
      lVar4 = *(longlong *)(local_2a8 + 8);
      lVar7 = *(longlong *)(local_2a8 + 0xc);
      auVar1 = vpmovzxbw_avx2(*in_stack_00000008);
      s0_01[1] = in_stack_fffffffffffffc60;
      s0_01[0] = lVar7;
      s0_01[2] = in_stack_fffffffffffffc68;
      s0_01[3] = in_stack_fffffffffffffc70;
      s1_01[1] = lVar9;
      s1_01[0] = *(longlong *)(local_2b0 + 0xc);
      s1_01[2] = lVar11;
      s1_01[3] = lVar4;
      a_00[1] = *(longlong *)local_2b0;
      a_00[0] = auVar1._24_8_;
      a_00[2] = *(longlong *)(local_2b0 + 4);
      a_00[3] = *(longlong *)(local_2b0 + 8);
      highbd_comp_mask_pred_line_avx2(s0_01,s1_01,a_00);
      *local_2a0 = lVar9;
      local_2a0[1] = lVar11;
      local_2a0[2] = lVar4;
      local_2a0[3] = lVar7;
      local_2a8 = local_2a8 + in_R9D;
      local_2b0 = local_2b0 + local_558;
      in_stack_00000008 = (undefined1 (*) [16])(*in_stack_00000008 + (int)mask);
      local_2a0 = local_2a0 + 4;
      local_288 = local_288 + 1;
    } while (local_288 < in_ECX);
  }
  else {
    do {
      for (local_424 = 0; local_424 < in_EDX; local_424 = local_424 + 0x20) {
        puVar3 = local_2a8 + local_424;
        lVar9 = *(longlong *)puVar3;
        lVar11 = *(longlong *)(puVar3 + 4);
        lVar4 = *(longlong *)(puVar3 + 8);
        lVar7 = *(longlong *)(puVar3 + 0xc);
        lVar5 = *(longlong *)(local_2a8 + (long)local_424 + 0x10);
        lVar8 = *(longlong *)(local_2a8 + (long)local_424 + 0x14);
        lVar10 = *(longlong *)(local_2a8 + (long)local_424 + 0x18);
        lVar12 = *(longlong *)(local_2a8 + (long)local_424 + 0x1c);
        vpmovzxbw_avx2(*(undefined1 (*) [16])(*in_stack_00000008 + local_424));
        vpmovzxbw_avx2(*(undefined1 (*) [16])(in_stack_00000008[1] + local_424));
        s0_02[1] = in_stack_fffffffffffffc60;
        s0_02[0] = in_stack_fffffffffffffc58;
        s0_02[2] = in_stack_fffffffffffffc68;
        s0_02[3] = in_stack_fffffffffffffc70;
        s1_02[1] = in_stack_fffffffffffffc40;
        s1_02[0] = in_stack_fffffffffffffc38;
        s1_02[2] = in_stack_fffffffffffffc48;
        s1_02[3] = in_stack_fffffffffffffc50;
        a_01[1] = in_stack_fffffffffffffc20;
        a_01[0] = in_stack_fffffffffffffc18;
        a_01[2] = in_stack_fffffffffffffc28;
        a_01[3] = in_stack_fffffffffffffc30;
        highbd_comp_mask_pred_line_avx2(s0_02,s1_02,a_01);
        s0_03[1] = in_stack_fffffffffffffc60;
        s0_03[0] = in_stack_fffffffffffffc58;
        s0_03[2] = in_stack_fffffffffffffc68;
        s0_03[3] = in_stack_fffffffffffffc70;
        s1_03[1] = in_stack_fffffffffffffc40;
        s1_03[0] = in_stack_fffffffffffffc38;
        s1_03[2] = in_stack_fffffffffffffc48;
        s1_03[3] = in_stack_fffffffffffffc50;
        a_02[1] = in_stack_fffffffffffffc20;
        a_02[0] = in_stack_fffffffffffffc18;
        a_02[2] = in_stack_fffffffffffffc28;
        a_02[3] = in_stack_fffffffffffffc30;
        highbd_comp_mask_pred_line_avx2(s0_03,s1_03,a_02);
        *local_2a0 = lVar9;
        local_2a0[1] = lVar11;
        local_2a0[2] = lVar4;
        local_2a0[3] = lVar7;
        local_2a0[4] = lVar5;
        local_2a0[5] = lVar8;
        local_2a0[6] = lVar10;
        local_2a0[7] = lVar12;
        local_2a0 = local_2a0 + 8;
      }
      local_2a8 = local_2a8 + in_R9D;
      in_stack_00000008 = (undefined1 (*) [16])(*in_stack_00000008 + (int)mask);
      local_288 = local_288 + 1;
    } while (local_288 < in_ECX);
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_avx2(uint8_t *comp_pred8, const uint8_t *pred8,
                                    int width, int height, const uint8_t *ref8,
                                    int ref_stride, const uint8_t *mask,
                                    int mask_stride, int invert_mask) {
  int i = 0;
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  const uint16_t *src0 = invert_mask ? pred : ref;
  const uint16_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  const __m256i zero = _mm256_setzero_si256();

  if (width == 8) {
    do {
      const __m256i s0 = mm256_loadu2_16(src0 + stride0, src0);
      const __m256i s1 = mm256_loadu2_16(src1 + stride1, src1);

      const __m128i m_l = _mm_loadl_epi64((const __m128i *)mask);
      const __m128i m_h = _mm_loadl_epi64((const __m128i *)(mask + 8));

      __m256i m = _mm256_castsi128_si256(m_l);
      m = _mm256_insertf128_si256(m, m_h, 1);
      const __m256i m_16 = _mm256_unpacklo_epi8(m, zero);

      const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m_16);

      _mm_storeu_si128((__m128i *)(comp_pred), _mm256_castsi256_si128(comp));

      _mm_storeu_si128((__m128i *)(comp_pred + width),
                       _mm256_extractf128_si256(comp, 1));

      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      comp_pred += (width << 1);
      i += 2;
    } while (i < height);
  } else if (width == 16) {
    do {
      const __m256i s0 = _mm256_loadu_si256((const __m256i *)(src0));
      const __m256i s1 = _mm256_loadu_si256((const __m256i *)(src1));
      const __m256i m_16 =
          _mm256_cvtepu8_epi16(_mm_loadu_si128((const __m128i *)mask));

      const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m_16);

      _mm256_storeu_si256((__m256i *)comp_pred, comp);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        const __m256i s0 = _mm256_loadu_si256((const __m256i *)(src0 + x));
        const __m256i s2 = _mm256_loadu_si256((const __m256i *)(src0 + x + 16));
        const __m256i s1 = _mm256_loadu_si256((const __m256i *)(src1 + x));
        const __m256i s3 = _mm256_loadu_si256((const __m256i *)(src1 + x + 16));

        const __m256i m01_16 =
            _mm256_cvtepu8_epi16(_mm_loadu_si128((const __m128i *)(mask + x)));
        const __m256i m23_16 = _mm256_cvtepu8_epi16(
            _mm_loadu_si128((const __m128i *)(mask + x + 16)));

        const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m01_16);
        const __m256i comp1 = highbd_comp_mask_pred_line_avx2(s2, s3, m23_16);

        _mm256_storeu_si256((__m256i *)comp_pred, comp);
        _mm256_storeu_si256((__m256i *)(comp_pred + 16), comp1);

        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i += 1;
    } while (i < height);
  }
}